

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::RadioButton(char *label,bool active)

{
  float text_baseline_y;
  ImGuiWindow *this;
  ImDrawList *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImGuiID id;
  ImU32 IVar6;
  int iVar7;
  undefined7 in_register_00000031;
  char *text;
  ImGuiCol idx;
  char cVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar9;
  bool held;
  bool hovered;
  ImRect total_bb;
  bool local_9a;
  bool local_99;
  float local_98;
  undefined4 local_94;
  ImVec2 local_90;
  float local_88;
  ImRect local_78;
  ImVec2 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ImVec2 local_38;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_94 = (undefined4)CONCAT71(in_register_00000031,active);
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar2 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_58._8_4_ = extraout_XMM0_Dc;
    local_58._0_4_ = IVar2.x;
    local_58._4_4_ = IVar2.y;
    local_58._12_4_ = extraout_XMM0_Dd;
    local_88 = GetFrameHeight();
    local_68 = (this->DC).CursorPos;
    fVar9 = 0.0;
    if (0.0 < (float)local_58._0_4_) {
      fVar9 = (pIVar3->Style).ItemInnerSpacing.x + (float)local_58._0_4_;
    }
    text_baseline_y = (pIVar3->Style).FramePadding.y;
    local_78.Max.x = fVar9 + local_88 + local_68.x;
    local_78.Min = local_68;
    local_78.Max.y = text_baseline_y + text_baseline_y + (float)local_58._4_4_ + local_68.y;
    uStack_60 = 0;
    ItemSize(&local_78,text_baseline_y);
    bVar5 = false;
    bVar4 = ItemAdd(&local_78,id,(ImRect *)0x0);
    if (bVar4) {
      local_48 = local_88 + local_68.x;
      fStack_44 = local_88 + local_68.y;
      fStack_40 = local_88 + (float)uStack_60;
      fStack_3c = local_88 + uStack_60._4_4_;
      local_90.y = (float)(int)((fStack_44 + local_68.y) * 0.5 + 0.5);
      local_90.x = (float)(int)((local_48 + local_68.x) * 0.5 + 0.5);
      local_98 = (local_88 + -1.0) * 0.5;
      bVar5 = ButtonBehavior(&local_78,id,&local_99,&local_9a,0);
      if (bVar5) {
        MarkItemEdited(id);
      }
      RenderNavHighlight(&local_78,id,1);
      iVar7 = ((local_9a ^ 1U) & local_99) + 7;
      idx = 9;
      if ((local_99 & 1U) == 0) {
        idx = iVar7;
      }
      pIVar1 = this->DrawList;
      if (local_9a == false) {
        idx = iVar7;
      }
      IVar6 = GetColorU32(idx,1.0);
      ImDrawList::AddCircleFilled(pIVar1,&local_90,local_98,IVar6,0x10);
      cVar8 = (char)local_94;
      if (cVar8 != '\0') {
        fVar9 = 1.0;
        if (1.0 <= (float)(int)(local_88 / 6.0)) {
          fVar9 = (float)(int)(local_88 / 6.0);
        }
        pIVar1 = this->DrawList;
        local_88 = local_98 - fVar9;
        IVar6 = GetColorU32(0x12,1.0);
        ImDrawList::AddCircleFilled(pIVar1,&local_90,local_88,IVar6,0x10);
      }
      if (0.0 < (pIVar3->Style).FrameBorderSize) {
        pIVar1 = this->DrawList;
        local_38.y = local_90.y + 1.0;
        local_38.x = local_90.x + 1.0;
        IVar6 = GetColorU32(6,1.0);
        cVar8 = (char)local_94;
        ImDrawList::AddCircle(pIVar1,&local_38,local_98,IVar6,0x10,(pIVar3->Style).FrameBorderSize);
        pIVar1 = this->DrawList;
        IVar6 = GetColorU32(5,1.0);
        ImDrawList::AddCircle(pIVar1,&local_90,local_98,IVar6,0x10,(pIVar3->Style).FrameBorderSize);
      }
      if (pIVar3->LogEnabled == true) {
        text = "( )";
        if (cVar8 != '\0') {
          text = "(x)";
        }
        LogRenderedText(&local_78.Min,text,(char *)0x0);
      }
      if (0.0 < (float)local_58._0_4_) {
        IVar2.y = (pIVar3->Style).FramePadding.y + local_68.y;
        IVar2.x = (pIVar3->Style).ItemInnerSpacing.x + local_48;
        RenderText(IVar2,label,(char *)0x0,true);
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::Combo(const char* label, int* current_item, const char* const items[], int items_count, int height_in_items)
{
    const bool value_changed = Combo(label, current_item, Items_ArrayGetter, (void*)items, items_count, height_in_items);
    return value_changed;
}